

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

CURLcode send_telnet_data(connectdata *conn,char *buffer,ssize_t nread)

{
  int iVar1;
  long lVar2;
  bool local_4a;
  pollfd local_48;
  pollfd pfd [1];
  CURLcode result;
  int out_count;
  ssize_t total_written;
  ssize_t bytes_written;
  ssize_t sStack_20;
  uchar outbuf [2];
  ssize_t nread_local;
  char *buffer_local;
  connectdata *conn_local;
  
  pfd[0].fd = 0;
  sStack_20 = nread;
  nread_local = (ssize_t)buffer;
  while( true ) {
    lVar2 = sStack_20;
    if (pfd[0].fd == 0) {
      sStack_20 = sStack_20 + -1;
    }
    if (pfd[0].fd != 0 || lVar2 == 0) break;
    lVar2 = nread_local + 1;
    bytes_written._6_1_ = *(char *)nread_local;
    pfd[0].events = 1;
    pfd[0].revents = 0;
    if (bytes_written._6_1_ == -1) {
      pfd[0].events = 2;
      pfd[0].revents = 0;
      bytes_written._7_1_ = 0xff;
    }
    _result = 0;
    do {
      local_48.fd = conn->sock[0];
      local_48.events = 4;
      iVar1 = Curl_poll(&local_48,1,-1);
      if (iVar1 == -1 || iVar1 == 0) {
        pfd[0].fd = 0x37;
      }
      else {
        total_written = 0;
        pfd[0].fd = Curl_write(conn,conn->sock[0],(void *)((long)&bytes_written + _result + 6),
                               (int)pfd[0]._4_4_ - _result,&total_written);
        _result = total_written + _result;
      }
      local_4a = pfd[0].fd == 0 && _result < (int)pfd[0]._4_4_;
      nread_local = lVar2;
    } while (local_4a);
  }
  return pfd[0].fd;
}

Assistant:

static CURLcode send_telnet_data(struct connectdata *conn,
                                 char *buffer, ssize_t nread)
{
  unsigned char outbuf[2];
  ssize_t bytes_written, total_written;
  int out_count;
  CURLcode result = CURLE_OK;

  while(!result && nread--) {
    outbuf[0] = *buffer++;
    out_count = 1;
    if(outbuf[0] == CURL_IAC)
      outbuf[out_count++] = CURL_IAC;

    total_written = 0;
    do {
      /* Make sure socket is writable to avoid EWOULDBLOCK condition */
      struct pollfd pfd[1];
      pfd[0].fd = conn->sock[FIRSTSOCKET];
      pfd[0].events = POLLOUT;
      switch(Curl_poll(pfd, 1, -1)) {
        case -1:                    /* error, abort writing */
        case 0:                     /* timeout (will never happen) */
          result = CURLE_SEND_ERROR;
          break;
        default:                    /* write! */
          bytes_written = 0;
          result = Curl_write(conn, conn->sock[FIRSTSOCKET],
                              outbuf+total_written, out_count-total_written,
                              &bytes_written);
          total_written += bytes_written;
          break;
      }
      /* handle partial write */
    } while(!result && total_written < out_count);
  }
  return result;
}